

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

void Mpm_ManPrepare(Mpm_Man_t *p)

{
  Mig_Fan_t MVar1;
  void *pvVar2;
  void **ppvVar3;
  Mig_Obj_t *pMVar4;
  int iVar5;
  Mpm_Cut_t *in_RAX;
  Mig_Man_t *pMVar6;
  uint *puVar7;
  uint uVar8;
  Mig_Obj_t *pMVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  Mpm_Cut_t *local_38;
  
  pMVar6 = p->pMig;
  if (0 < (pMVar6->vCis).nSize) {
    lVar11 = 0;
    local_38 = in_RAX;
    do {
      if ((pMVar6->vCis).nSize <= lVar11) {
LAB_00408b4e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar8 = (pMVar6->vCis).pArray[lVar11];
      if (((int)uVar8 < 0) || (pMVar6->nObjs <= (int)uVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                      ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
      }
      if ((pMVar6->vPages).nSize <= (int)(uVar8 >> 0xc)) goto LAB_00408b8c;
      pvVar2 = (pMVar6->vPages).pArray[uVar8 >> 0xc];
      if (pvVar2 == (void *)0x0) break;
      uVar10 = (ulong)((uVar8 & 0xfff) << 4);
      uVar8 = *(uint *)((long)pvVar2 + uVar10 + 0xc);
      iVar5 = Mpm_CutAlloc(p,1,&local_38);
      if (p->funcVar0 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      puVar7 = (uint *)((long)pvVar2 + uVar10 + 0xc);
      *(uint *)&local_38->field_0x4 =
           (*(uint *)&local_38->field_0x4 & 0xfe000000) + (p->funcVar0 & 0xffffffU) * 2;
      local_38->pLeaves[0] = uVar8 & 0xfffffffe;
      uVar8 = *puVar7 >> 1;
      if ((p->vCutBests).nSize <= (int)uVar8) {
LAB_00408b2f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCutBests).pArray[uVar8] = iVar5;
      uVar8 = *puVar7 >> 1;
      if ((p->vCutLists).nSize <= (int)uVar8) goto LAB_00408b2f;
      (p->vCutLists).pArray[uVar8] = iVar5;
      lVar11 = lVar11 + 1;
      pMVar6 = p->pMig;
    } while (lVar11 < (pMVar6->vCis).nSize);
  }
  pMVar6->iPage = 0;
  if (0 < (pMVar6->vPages).nSize) {
    ppvVar3 = (pMVar6->vPages).pArray;
    uVar8 = 0;
    do {
      if ((int)uVar8 < 0) {
LAB_00408b8c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pMVar9 = (Mig_Obj_t *)ppvVar3[uVar8];
      pMVar6->pPage = pMVar9;
      if (pMVar9 == (Mig_Obj_t *)0x0) {
        return;
      }
      MVar1 = pMVar9->pFans[3];
      while ((uint)MVar1 < 0xfffffffe) {
        bVar12 = (uint)pMVar9->pFans[1] < 0xfffffffe;
        if (bVar12) {
LAB_00408ac2:
          if (bVar12) {
            uVar8 = (uint)MVar1 >> 1;
            lVar11 = *(long *)((long)pMVar9 + (-0x10 - (ulong)((uVar8 & 0xfff) << 4)));
            if (*(int *)(lVar11 + 0x8c) <= (int)uVar8) goto LAB_00408b4e;
            if ((p->vEstRefs).nSize <= (int)uVar8) goto LAB_00408b2f;
            (p->vEstRefs).pArray[uVar8] =
                 *(int *)(*(long *)(lVar11 + 0x90) + (ulong)uVar8 * 4) * 100;
          }
        }
        else if ((uint)pMVar9->pFans[2] < 0xfffffffe) {
          bVar12 = 0xfffffffd < (uint)pMVar9->pFans[0];
          goto LAB_00408ac2;
        }
        pMVar4 = pMVar9 + 1;
        pMVar9 = pMVar9 + 1;
        MVar1 = pMVar4->pFans[3];
      }
      uVar8 = pMVar6->iPage + 1;
      pMVar6->iPage = uVar8;
    } while ((int)uVar8 < (pMVar6->vPages).nSize);
  }
  return;
}

Assistant:

void Mpm_ManPrepare( Mpm_Man_t * p )
{
    Mig_Obj_t * pObj;
    int i, hCut;
    Mig_ManForEachCi( p->pMig, pObj, i )
    {
        hCut = Mpm_CutCreateUnit( p, Mig_ObjId(pObj) );
        Mpm_ObjSetCutBest( p, pObj, hCut );
        Mpm_ObjSetCutList( p, pObj, hCut );
    }
    Mig_ManForEachCand( p->pMig, pObj )
        Mpm_ObjSetEstRef( p, pObj, MPM_UNIT_REFS * Mig_ObjRefNum(pObj) );
}